

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O2

Violation mp::
          ComputeViolation<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::OrId,mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
                    (CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::OrId>
                     *c,VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  int i;
  CtxVal CVar1;
  double dVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  double dVar5;
  double dVar6;
  Violation VVar7;
  
  i = (c->super_FunctionalConstraint).result_var_;
  dVar5 = (x->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[i];
  if (x->recomp_vals_ == false) {
    dVar6 = ComputeValue<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>(c,x);
    dVar5 = dVar5 - dVar6;
    CVar1 = (c->super_FunctionalConstraint).ctx.value_;
    if (CVar1 != CTX_POS) {
      if (CVar1 == CTX_NEG) {
        dVar5 = -dVar5;
      }
      else {
        if (CVar1 != CTX_MIX) {
          dVar6 = 0.0;
          dVar5 = INFINITY;
          goto LAB_0018d858;
        }
        dVar5 = ABS(dVar5);
      }
    }
  }
  else {
    dVar6 = (x->x_raw_).data_[i];
    dVar2 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::bounds_viol(x,i);
    uVar3 = SUB84(dVar2,0);
    uVar4 = (undefined4)((ulong)dVar2 >> 0x20);
    if (dVar2 <= 0.0) {
      uVar3 = 0;
      uVar4 = 0;
    }
    dVar5 = ABS(dVar5 - dVar6) + (double)CONCAT44(uVar4,uVar3);
  }
  dVar6 = (x->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[i];
LAB_0018d858:
  VVar7.valX_ = dVar6;
  VVar7.viol_ = dVar5;
  return VVar7;
}

Assistant:

Violation ComputeViolation(
    const CustomFunctionalConstraint<Args, Params, NumOrLogic, Id>& c,
    const VarVec& x) {
  auto resvar = c.GetResultVar();
  if (!x.recomp_vals()) {    // solver's var values: normal check
    auto viol = x[resvar] - ComputeValue(c, x);
    switch (c.GetContext().GetValue()) {
    case Context::CTX_MIX:
      return {std::fabs(viol), x[resvar]};
    case Context::CTX_POS:
      return {viol, x[resvar]};
    case Context::CTX_NEG:
      return {-viol, x[resvar]};
    default:
      return {INFINITY, 0.0};
    }
  }
  return                              // recomputed var minus solver's
  { std::fabs(x[resvar] - x.raw(resvar))
        + std::max(0.0, x.bounds_viol(resvar)), x[resvar]};
}